

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::get_unit(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  undefined4 uVar2;
  long *plVar3;
  precise_unit pVar4;
  precise_unit pVar5;
  precise_unit pVar6;
  bool bVar7;
  int iVar8;
  unit_data uVar9;
  uint uVar10;
  iterator iVar11;
  size_t sVar12;
  precise_unit *ppVar13;
  const_iterator cVar14;
  long lVar15;
  uint uVar16;
  __hash_code __code;
  ulong uVar17;
  long *plVar18;
  long *plVar19;
  undefined8 unaff_R14;
  string *unit_string_00;
  double extraout_XMM0_Qa;
  double dVar20;
  precise_unit pVar21;
  precise_unit actUnit;
  size_t index;
  char *ptr;
  undefined8 local_28;
  size_t *local_20;
  size_t *index_00;
  
  if (((_ZN5unitsL21allowUserDefinedUnitsE_0 & 1) != 0) &&
     (user_defined_units_abi_cxx11_._24_8_ != 0)) {
    iVar11 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)user_defined_units_abi_cxx11_,unit_string);
    dVar20 = extraout_XMM0_Qa;
    if (iVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
        ._M_cur != (__node_type *)0x0) {
      dVar20 = *(double *)
                ((long)iVar11.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                       ._M_cur + 0x28);
      unaff_R14 = *(undefined8 *)
                   ((long)iVar11.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                          ._M_cur + 0x30);
    }
    pVar4.base_units_ = (unit_data)(int)unaff_R14;
    pVar4.commodity_ = (int)((ulong)unaff_R14 >> 0x20);
    pVar4.multiplier_ = dVar20;
    if (iVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
        ._M_cur != (__node_type *)0x0) {
      return pVar4;
    }
  }
  uVar17 = match_flags & 0xff;
  if ((match_flags & 0xff) == 0) {
    uVar17 = unitsDomain;
  }
  if (uVar17 != 0) {
    sVar12 = std::
             hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_28,unit_string);
    uVar17 = sVar12 ^ uVar17;
    plVar18 = *(long **)(domainSpecificUnit + (uVar17 % _DAT_00597d28) * 8);
    plVar19 = (long *)0x0;
    if ((plVar18 != (long *)0x0) &&
       (plVar3 = (long *)*plVar18, plVar19 = plVar18, uVar17 != ((long *)*plVar18)[1])) {
      while (plVar18 = plVar3, plVar3 = (long *)*plVar18, plVar3 != (long *)0x0) {
        plVar19 = (long *)0x0;
        if (((ulong)plVar3[1] % _DAT_00597d28 != uVar17 % _DAT_00597d28) ||
           (plVar19 = plVar18, uVar17 == plVar3[1])) goto LAB_00403754;
      }
      plVar19 = (long *)0x0;
    }
LAB_00403754:
    if (plVar19 == (long *)0x0) {
      lVar15 = 0;
    }
    else {
      lVar15 = *plVar19;
    }
    ppVar13 = (precise_unit *)&precise::invalid;
    if (lVar15 != 0) {
      ppVar13 = (precise_unit *)(lVar15 + 0x10);
    }
    uVar2 = ppVar13->base_units_;
    if (uVar2 != -0x56b5b78 || !NAN(ppVar13->multiplier_)) {
      return *ppVar13;
    }
  }
  cVar14 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)base_unit_vals_abi_cxx11_,unit_string);
  if (cVar14.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(precise_unit *)
            ((long)cVar14.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                   ._M_cur + 0x28);
  }
  cVar1 = *(unit_string->_M_dataplus)._M_p;
  pVar6.base_units_ = (unit_data)0xfa94a488;
  pVar6.commodity_ = 0;
  pVar6.multiplier_ = NAN;
  pVar5.base_units_ = (unit_data)0xfa94a488;
  pVar5.commodity_ = 0;
  pVar5.multiplier_ = NAN;
  if ((cVar1 != 'E') && (cVar1 != 'C')) {
    return pVar5;
  }
  if (unit_string->_M_string_length < 6) {
    return pVar6;
  }
  local_28 = 0;
  iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,5,"CXUN[");
  if ((iVar8 != 0) || (bVar7 = hasAdditionalOps(unit_string), bVar7)) {
LAB_00403840:
    iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,0,6,"CXCUN[");
    if ((iVar8 == 0) && (bVar7 = hasAdditionalOps(unit_string), !bVar7)) {
      local_20 = (size_t *)0x0;
      lVar15 = strtol((unit_string->_M_dataplus)._M_p + 6,(char **)&local_20,0);
      if ((char)*local_20 == ']') {
        uVar16 = (int)((uint)lVar15 << 0x1c) >> 0x11 & 0xc000;
        index_00 = (size_t *)(ulong)uVar16;
        uVar10 = (((uint)lVar15 & 7) << 0x18 | 0xc00) << 4 | 0x50000;
        uVar10 = (uVar10 >> 2 & 0x10013000) + (uVar10 & 0x30010000) * 4;
        uVar9 = (unit_data)((uVar10 >> 1 & 0x40001000) + (uVar10 & 0x50051000) * 2 >> 1 | uVar16);
        goto LAB_004038dc;
      }
    }
    iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,0,6,"EQXUN[");
    if ((iVar8 == 0) && (bVar7 = hasAdditionalOps(unit_string), !bVar7)) {
      local_20 = (size_t *)0x0;
      lVar15 = strtol((unit_string->_M_dataplus)._M_p + 6,(char **)&local_20,0);
      if ((char)*local_20 == ']') {
        uVar10 = (uint)lVar15;
        uVar16 = (uVar10 & 0x10) << 0x11;
        index_00 = (size_t *)(ulong)uVar16;
        unit_string_00 =
             (string *)
             ((ulong)((uVar10 & 1) << 0x1e | uVar16 | (uVar10 & 8) << 0x17 | (uVar10 & 4) << 0x1a |
                     (uVar10 & 2) << 0x1c) | 0x80000000);
        goto LAB_00403987;
      }
    }
    pVar21.base_units_ = (unit_data)0xfa94a488;
    pVar21.commodity_ = 0;
    pVar21.multiplier_ = NAN;
  }
  else {
    local_20 = (size_t *)0x0;
    lVar15 = strtol((unit_string->_M_dataplus)._M_p + 5,(char **)&local_20,0);
    if ((char)*local_20 != ']') goto LAB_00403840;
    index_00 = local_20;
    uVar9 = precise::custom::custom_unit((uint16_t)lVar15);
LAB_004038dc:
    unit_string_00 = (string *)(ulong)(uint)uVar9;
LAB_00403987:
    actUnit._8_8_ = &local_28;
    actUnit.multiplier_ = 1.0;
    pVar21 = commoditizedUnit((units *)unit_string,unit_string_00,actUnit,index_00);
  }
  return pVar21;
}

Assistant:

static precise_unit
    get_unit(const std::string& unit_string, std::uint64_t match_flags)
{
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_units.empty()) {
            auto fnd2 = user_defined_units.find(unit_string);
            if (fnd2 != user_defined_units.end()) {
                return fnd2->second;
            }
        }
    }

    auto cdomain = getCurrentDomain(match_flags);
    if (cdomain != domains::defaultDomain) {
        auto dmunit = getDomainUnit(cdomain, unit_string);
        if (is_valid(dmunit)) {
            return dmunit;
        }
    }

    auto fnd = base_unit_vals.find(unit_string);
    if (fnd != base_unit_vals.end()) {
        return fnd->second;
    }
    // empty string would have been found already
    auto c = unit_string.front();
    if ((c == 'C' || c == 'E') && unit_string.size() >= 6) {
        size_t index{0};
        if (unit_string.compare(0, 5, "CXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 5, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string, precise::generate_custom_unit(num), index);
                }
            }
        }
        if (unit_string.compare(0, 6, "CXCUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise::generate_custom_count_unit(num),
                        index);
                }
            }
        }
        if (unit_string.compare(0, 6, "EQXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise_unit(precise::custom::equation_unit(num)),
                        index);
                }
            }
        }
    }
    return precise::invalid;
}